

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O0

void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *pFanin,Bac_Ntk_t *p,int iTerm)

{
  Bac_Man_t *pBVar1;
  int iVar2;
  bool local_21;
  int local_20;
  int iObj;
  int iTerm_local;
  Bac_Ntk_t *p_local;
  Abc_Obj_t *pFanin_local;
  
  if ((pFanin == (Abc_Obj_t *)0x0) || (iVar2 = Abc_NodeIsSeriousGate(pFanin), iVar2 == 0)) {
    if ((pFanin == (Abc_Obj_t *)0x0) ||
       (((iVar2 = Abc_ObjIsPi(pFanin), iVar2 == 0 && (iVar2 = Abc_ObjIsBarBuf(pFanin), iVar2 == 0))
        && (iVar2 = Abc_NodeIsSeriousGate(pFanin), iVar2 == 0)))) {
      if (((pFanin != (Abc_Obj_t *)0x0) && (iVar2 = Abc_NodeIsConst0(pFanin), iVar2 == 0)) &&
         (iVar2 = Abc_NodeIsConst1(pFanin), iVar2 == 0)) {
        __assert_fail("!pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                      ,0x1e4,"void Bac_NtkCreateOrConnectFanin(Abc_Obj_t *, Bac_Ntk_t *, int)");
      }
      pBVar1 = p->pDesign;
      local_21 = false;
      if (pFanin != (Abc_Obj_t *)0x0) {
        iVar2 = Abc_NodeIsConst1(pFanin);
        local_21 = iVar2 != 0;
      }
      Bac_ObjAlloc(p,BAC_BOX_GATE,pBVar1->ElemGates[(int)(uint)local_21]);
      local_20 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
    }
    else {
      Bac_ObjAlloc(p,BAC_OBJ_BI,(pFanin->field_6).iTemp);
      Bac_ObjAlloc(p,BAC_BOX_GATE,p->pDesign->ElemGates[2]);
      local_20 = Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
    }
  }
  else {
    local_20 = (pFanin->field_6).iTemp;
  }
  Bac_ObjSetFanin(p,iTerm,local_20);
  return;
}

Assistant:

void Bac_NtkCreateOrConnectFanin( Abc_Obj_t * pFanin, Bac_Ntk_t * p, int iTerm )
{
    int iObj;
    if ( pFanin && Abc_NodeIsSeriousGate(pFanin) )//&& Bac_ObjName(p, pFanin->iTemp) == -1 ) // gate without name
    {
        iObj = pFanin->iTemp;
    }
    else if ( pFanin && (Abc_ObjIsPi(pFanin) || Abc_ObjIsBarBuf(pFanin) || Abc_NodeIsSeriousGate(pFanin)) ) // PI/BO or gate with name
    {
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BI, pFanin->iTemp );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[2] ); // buffer
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    else
    {
        assert( !pFanin || Abc_NodeIsConst0(pFanin) || Abc_NodeIsConst1(pFanin) );
        Bac_ObjAlloc( p, BAC_BOX_GATE, p->pDesign->ElemGates[(pFanin && Abc_NodeIsConst1(pFanin))] ); // const 0/1
        iObj = Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    }
    Bac_ObjSetFanin( p, iTerm, iObj );
}